

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter.h
# Opt level: O0

void aom_write(aom_writer *w,int bit,int probability)

{
  undefined8 in_RDI;
  int p;
  od_ec_enc *unaff_retaddr;
  
  od_ec_encode_bool_q15(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  return;
}

Assistant:

static inline void aom_write(aom_writer *w, int bit, int probability) {
  int p = (0x7FFFFF - (probability << 15) + probability) >> 8;
#if CONFIG_BITSTREAM_DEBUG
  aom_cdf_prob cdf[2] = { (aom_cdf_prob)p, 32767 };
  bitstream_queue_push(bit, cdf, 2);
#endif

  od_ec_encode_bool_q15(&w->ec, bit, p);
}